

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O0

void __thiscall
xemmai::t_define<t_container>::f_derive<t_queue,xemmai::t_sharable>(t_define<t_container> *this)

{
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_> *this_00;
  t_type *this_01;
  t_object *ptVar1;
  t_define<t_container> *this_local;
  
  this_00 = t_container::f_type_slot<t_queue>(this->v_library);
  this_01 = t_container::f_type<xemmai::t_sharable>(this->v_library);
  ptVar1 = t_object::f_of(this->v_library);
  ptVar1 = t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<t_queue>>
                     (this_01,ptVar1,&this->v_fields);
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct(this_00,ptVar1);
  return;
}

Assistant:

void f_derive()
	{
		v_library->template f_type_slot<T>().f_construct(v_library->template f_type<T_super>()->template f_derive<t_type_of<T>>(t_object::f_of(v_library), v_fields));
	}